

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::CommandLineInterfaceTest::SetUp
          (CommandLineInterfaceTest *this)

{
  pointer pMVar1;
  pointer pNVar2;
  allocator<char> local_1d1;
  string local_1d0;
  unique_ptr<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>
  local_1b0;
  allocator<char> local_1a1;
  string local_1a0;
  unique_ptr<google::protobuf::compiler::(anonymous_namespace)::CommandLineInterfaceTest::NullCodeGenerator,_std::default_delete<google::protobuf::compiler::(anonymous_namespace)::CommandLineInterfaceTest::NullCodeGenerator>_>
  local_180;
  __single_object null_generator;
  string local_170;
  unique_ptr<google::protobuf::compiler::MockCodeGenerator,_std::default_delete<google::protobuf::compiler::MockCodeGenerator>_>
  local_150;
  unique_ptr<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>
  local_148;
  allocator<char> local_139;
  string local_138;
  allocator<char> local_111;
  string local_110;
  unique_ptr<google::protobuf::compiler::MockCodeGenerator,_std::default_delete<google::protobuf::compiler::MockCodeGenerator>_>
  local_f0;
  unique_ptr<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>
  local_e8;
  allocator<char> local_d9;
  string local_d8;
  allocator<char> local_b1;
  string local_b0;
  unique_ptr<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>
  local_90;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  unique_ptr<google::protobuf::compiler::MockCodeGenerator,_std::default_delete<google::protobuf::compiler::MockCodeGenerator>_>
  local_28;
  __single_object mock_generator;
  CommandLineInterfaceTest *this_local;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&mock_generator,
             anon_var_dwarf_37cdd0 + 5);
  SetMockGeneratorTestCase(this,_mock_generator);
  std::make_unique<google::protobuf::compiler::MockCodeGenerator,char_const(&)[15]>
            ((char (*) [15])&local_28);
  pMVar1 = std::
           unique_ptr<google::protobuf::compiler::MockCodeGenerator,_std::default_delete<google::protobuf::compiler::MockCodeGenerator>_>
           ::get(&local_28);
  this->mock_generator_ = pMVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"--test_out",&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"--test_opt",&local_81);
  std::
  unique_ptr<google::protobuf::compiler::CodeGenerator,std::default_delete<google::protobuf::compiler::CodeGenerator>>
  ::
  unique_ptr<google::protobuf::compiler::MockCodeGenerator,std::default_delete<google::protobuf::compiler::MockCodeGenerator>,void>
            ((unique_ptr<google::protobuf::compiler::CodeGenerator,std::default_delete<google::protobuf::compiler::CodeGenerator>>
              *)&local_90,&local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"Test output.",&local_b1);
  CommandLineInterfaceTester::RegisterGenerator
            (&this->super_CommandLineInterfaceTester,&local_48,&local_80,&local_90,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  std::
  unique_ptr<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>
  ::~unique_ptr(&local_90);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"-t",&local_d9);
  std::make_unique<google::protobuf::compiler::MockCodeGenerator,char_const(&)[15]>
            ((char (*) [15])&local_f0);
  std::
  unique_ptr<google::protobuf::compiler::CodeGenerator,std::default_delete<google::protobuf::compiler::CodeGenerator>>
  ::
  unique_ptr<google::protobuf::compiler::MockCodeGenerator,std::default_delete<google::protobuf::compiler::MockCodeGenerator>,void>
            ((unique_ptr<google::protobuf::compiler::CodeGenerator,std::default_delete<google::protobuf::compiler::CodeGenerator>>
              *)&local_e8,&local_f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"Test output.",&local_111)
  ;
  CommandLineInterfaceTester::RegisterGenerator
            (&this->super_CommandLineInterfaceTester,&local_d8,&local_e8,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  std::
  unique_ptr<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>
  ::~unique_ptr(&local_e8);
  std::
  unique_ptr<google::protobuf::compiler::MockCodeGenerator,_std::default_delete<google::protobuf::compiler::MockCodeGenerator>_>
  ::~unique_ptr(&local_f0);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"--alt_out",&local_139);
  std::make_unique<google::protobuf::compiler::MockCodeGenerator,char_const(&)[14]>
            ((char (*) [14])&local_150);
  std::
  unique_ptr<google::protobuf::compiler::CodeGenerator,std::default_delete<google::protobuf::compiler::CodeGenerator>>
  ::
  unique_ptr<google::protobuf::compiler::MockCodeGenerator,std::default_delete<google::protobuf::compiler::MockCodeGenerator>,void>
            ((unique_ptr<google::protobuf::compiler::CodeGenerator,std::default_delete<google::protobuf::compiler::CodeGenerator>>
              *)&local_148,&local_150);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"Alt output.",
             (allocator<char> *)
             ((long)&null_generator._M_t.
                     super___uniq_ptr_impl<google::protobuf::compiler::(anonymous_namespace)::CommandLineInterfaceTest::NullCodeGenerator,_std::default_delete<google::protobuf::compiler::(anonymous_namespace)::CommandLineInterfaceTest::NullCodeGenerator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_google::protobuf::compiler::(anonymous_namespace)::CommandLineInterfaceTest::NullCodeGenerator_*,_std::default_delete<google::protobuf::compiler::(anonymous_namespace)::CommandLineInterfaceTest::NullCodeGenerator>_>
                     .
                     super__Head_base<0UL,_google::protobuf::compiler::(anonymous_namespace)::CommandLineInterfaceTest::NullCodeGenerator_*,_false>
                     ._M_head_impl + 7));
  CommandLineInterfaceTester::RegisterGenerator
            (&this->super_CommandLineInterfaceTester,&local_138,&local_148,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&null_generator._M_t.
                     super___uniq_ptr_impl<google::protobuf::compiler::(anonymous_namespace)::CommandLineInterfaceTest::NullCodeGenerator,_std::default_delete<google::protobuf::compiler::(anonymous_namespace)::CommandLineInterfaceTest::NullCodeGenerator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_google::protobuf::compiler::(anonymous_namespace)::CommandLineInterfaceTest::NullCodeGenerator_*,_std::default_delete<google::protobuf::compiler::(anonymous_namespace)::CommandLineInterfaceTest::NullCodeGenerator>_>
                     .
                     super__Head_base<0UL,_google::protobuf::compiler::(anonymous_namespace)::CommandLineInterfaceTest::NullCodeGenerator_*,_false>
                     ._M_head_impl + 7));
  std::
  unique_ptr<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>
  ::~unique_ptr(&local_148);
  std::
  unique_ptr<google::protobuf::compiler::MockCodeGenerator,_std::default_delete<google::protobuf::compiler::MockCodeGenerator>_>
  ::~unique_ptr(&local_150);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  std::
  make_unique<google::protobuf::compiler::(anonymous_namespace)::CommandLineInterfaceTest::NullCodeGenerator>
            ();
  pNVar2 = std::
           unique_ptr<google::protobuf::compiler::(anonymous_namespace)::CommandLineInterfaceTest::NullCodeGenerator,_std::default_delete<google::protobuf::compiler::(anonymous_namespace)::CommandLineInterfaceTest::NullCodeGenerator>_>
           ::get(&local_180);
  this->null_generator_ = pNVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"--null_out",&local_1a1);
  std::
  unique_ptr<google::protobuf::compiler::CodeGenerator,std::default_delete<google::protobuf::compiler::CodeGenerator>>
  ::
  unique_ptr<google::protobuf::compiler::(anonymous_namespace)::CommandLineInterfaceTest::NullCodeGenerator,std::default_delete<google::protobuf::compiler::(anonymous_namespace)::CommandLineInterfaceTest::NullCodeGenerator>,void>
            ((unique_ptr<google::protobuf::compiler::CodeGenerator,std::default_delete<google::protobuf::compiler::CodeGenerator>>
              *)&local_1b0,&local_180);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"Null output.",&local_1d1)
  ;
  CommandLineInterfaceTester::RegisterGenerator
            (&this->super_CommandLineInterfaceTester,&local_1a0,&local_1b0,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  std::
  unique_ptr<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>
  ::~unique_ptr(&local_1b0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  std::
  unique_ptr<google::protobuf::compiler::(anonymous_namespace)::CommandLineInterfaceTest::NullCodeGenerator,_std::default_delete<google::protobuf::compiler::(anonymous_namespace)::CommandLineInterfaceTest::NullCodeGenerator>_>
  ::~unique_ptr(&local_180);
  std::
  unique_ptr<google::protobuf::compiler::MockCodeGenerator,_std::default_delete<google::protobuf::compiler::MockCodeGenerator>_>
  ::~unique_ptr(&local_28);
  return;
}

Assistant:

void CommandLineInterfaceTest::SetUp() {
  // Reset the mock generator's test case environment variable.
  SetMockGeneratorTestCase("");

  // Register generators.
  auto mock_generator = std::make_unique<MockCodeGenerator>("test_generator");
  mock_generator_ = mock_generator.get();
  RegisterGenerator("--test_out", "--test_opt", std::move(mock_generator),
                    "Test output.");
  RegisterGenerator("-t", std::make_unique<MockCodeGenerator>("test_generator"),
                    "Test output.");

  RegisterGenerator("--alt_out",
                    std::make_unique<MockCodeGenerator>("alt_generator"),
                    "Alt output.");

  auto null_generator = std::make_unique<NullCodeGenerator>();
  null_generator_ = null_generator.get();
  RegisterGenerator("--null_out", std::move(null_generator), "Null output.");

}